

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.h
# Opt level: O0

int FNodeBuilder::PointOnSide(int x,int y,int x1,int y1,int dx,int dy)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dist;
  double l;
  double s_num;
  double d_y1;
  double d_x1;
  double d_y;
  double d_x;
  double d_dy;
  double d_dx;
  int dy_local;
  int dx_local;
  int y1_local;
  int x1_local;
  int y_local;
  int x_local;
  
  dVar1 = (double)dx;
  dVar2 = (double)dy;
  dVar3 = ((double)y1 - (double)y) * dVar1 - ((double)x1 - (double)x) * dVar2;
  if ((17179869184.0 <= ABS(dVar3)) ||
     (42.94967296 <= (dVar3 * dVar3) / (dVar1 * dVar1 + dVar2 * dVar2))) {
    y_local = 1;
    if (0.0 < dVar3) {
      y_local = -1;
    }
  }
  else {
    y_local = 0;
  }
  return y_local;
}

Assistant:

inline int FNodeBuilder::PointOnSide (int x, int y, int x1, int y1, int dx, int dy)
{
	// For most cases, a simple dot product is enough.
	double d_dx = double(dx);
	double d_dy = double(dy);
	double d_x = double(x);
	double d_y = double(y);
	double d_x1 = double(x1);
	double d_y1 = double(y1);

	double s_num = (d_y1-d_y)*d_dx - (d_x1-d_x)*d_dy;

	if (fabs(s_num) < 17179869184.f)	// 4<<32
	{
		// Either the point is very near the line, or the segment defining
		// the line is very short: Do a more expensive test to determine
		// just how far from the line the point is.
		double l = d_dx*d_dx + d_dy*d_dy;		// double l = sqrt(d_dx*d_dx+d_dy*d_dy);
		double dist = s_num * s_num / l;		// double dist = fabs(s_num)/l;
		if (dist < SIDE_EPSILON*SIDE_EPSILON)	// if (dist < SIDE_EPSILON)
		{
			return 0;
		}
	}
	return s_num > 0.0 ? -1 : 1;
}